

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall c4::yml::Parser::_finish_filter_arena(Parser *this,substr dst,size_t pos)

{
  code *pcVar1;
  substr sVar2;
  bool bVar3;
  error_flags eVar4;
  basic_substring<char> *in_RCX;
  basic_substring<char> *in_RDX;
  void *in_RSI;
  long in_RDI;
  char msg_1 [31];
  char msg [42];
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  char local_e8 [48];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  undefined1 local_98 [56];
  basic_substring<char> *local_60;
  void *local_50;
  basic_substring<char> *local_48;
  char *local_30;
  undefined4 local_28;
  basic_substring<char> *local_20;
  void **local_18;
  char *local_10;
  size_t local_8;
  
  local_60 = in_RCX;
  local_50 = in_RSI;
  local_48 = in_RDX;
  if (*(basic_substring<char> **)(in_RDI + 0xa80) < in_RCX) {
    memcpy(local_98,"check failed: (pos <= m_filter_arena.len)",0x2a);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(local_98,0x2a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe80 = uStack_b8;
    in_stack_fffffffffffffe84 = uStack_b4;
    in_stack_fffffffffffffe88 = local_b0;
    in_stack_fffffffffffffe8c = uStack_ac;
    in_stack_fffffffffffffe90 = uStack_a8;
    in_stack_fffffffffffffe94 = uStack_a4;
    in_stack_fffffffffffffe98 = local_a0;
  }
  if (local_48 < local_60) {
    builtin_strncpy(local_e8,"check failed: (pos <= dst.len)",0x1f);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(local_e8,0x1f,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe90 = uStack_f8;
    in_stack_fffffffffffffe94 = uStack_f4;
    in_stack_fffffffffffffe98 = local_f0;
  }
  memcpy(local_50,*(void **)(in_RDI + 0xa78),(size_t)local_60);
  local_18 = &local_50;
  local_20 = local_60;
  if (local_48 < local_60 && local_60 != (basic_substring<char> *)0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x154e;
    handle_error(0x389522,(char *)0x154e,"check failed: %s","num <= len || num == npos");
  }
  if (local_20 != (basic_substring<char> *)0xffffffffffffffff) {
    local_48 = local_20;
  }
  basic_substring<char>::basic_substring
            (local_48,in_stack_fffffffffffffe98,
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  sVar2.len = local_8;
  sVar2.str = local_10;
  return sVar2;
}

Assistant:

substr Parser::_finish_filter_arena(substr dst, size_t pos)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= dst.len);
    memcpy(dst.str, m_filter_arena.str, pos);
    return dst.first(pos);
}